

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O3

lzham_compress_status_t
lzham::create_init_params(init_params *params,lzham_compress_params *pParams)

{
  lzham_uint32 lVar1;
  uint uVar2;
  uint uVar3;
  
  if (0xfffffff0 < pParams->m_dict_size_log2 - 0x1e) {
    lVar1 = pParams->m_cpucache_total_lines;
    uVar2 = pParams->m_cpucache_line_size;
    if ((lVar1 == 0) ||
       (uVar3 = uVar2 - (uVar2 >> 1 & 0x55555555),
       uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
       ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18 == 1)) {
      params->m_dict_size_log2 = pParams->m_dict_size_log2;
      uVar3 = 0x10;
      if (pParams->m_max_helper_threads < 0x10) {
        uVar3 = pParams->m_max_helper_threads;
      }
      params->m_max_helper_threads = uVar3;
      params->m_num_cachelines = lVar1;
      params->m_cacheline_size = uVar2;
      params->m_lzham_compress_flags = pParams->m_compress_flags;
      if (pParams->m_level < cCompressionLevelCount) {
        params->m_compression_level = pParams->m_level;
        return LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
      }
    }
  }
  return LZHAM_COMP_STATUS_INVALID_PARAMETER;
}

Assistant:

static lzham_compress_status_t create_init_params(lzcompressor::init_params &params, const lzham_compress_params *pParams)
   {
      if ((pParams->m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      
      if (pParams->m_cpucache_total_lines)
      {
         if (!math::is_power_of_2(pParams->m_cpucache_line_size))
         {
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
         }
      }
         
      params.m_dict_size_log2 = pParams->m_dict_size_log2;
      params.m_max_helper_threads = LZHAM_MIN(LZHAM_MAX_HELPER_THREADS, pParams->m_max_helper_threads);
      params.m_num_cachelines = pParams->m_cpucache_total_lines;
      params.m_cacheline_size = pParams->m_cpucache_line_size;
      params.m_lzham_compress_flags = pParams->m_compress_flags;
      
      switch (pParams->m_level)
      {
         case LZHAM_COMP_LEVEL_FASTEST:   params.m_compression_level = cCompressionLevelFastest; break;
         case LZHAM_COMP_LEVEL_FASTER:    params.m_compression_level = cCompressionLevelFaster; break;
         case LZHAM_COMP_LEVEL_DEFAULT:   params.m_compression_level = cCompressionLevelDefault; break;
         case LZHAM_COMP_LEVEL_BETTER:    params.m_compression_level = cCompressionLevelBetter; break;
         case LZHAM_COMP_LEVEL_UBER:      params.m_compression_level = cCompressionLevelUber; break;
         default:
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      };
   
      return LZHAM_COMP_STATUS_SUCCESS;
   }